

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::DebuggerScope::EnsurePropertyListIsAllocated(DebuggerScope *this)

{
  Recycler *alloc;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *ptr;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if ((this->scopeProperties).ptr !=
      (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    return;
  }
  local_40 = (undefined1  [8])
             &JsUtil::
              List<Js::DebuggerScopeProperty,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x1748;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_40);
  ptr = (List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         *)new<Memory::Recycler>(0x30,alloc,0x37a1d4);
  (ptr->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).alloc =
       this->recycler;
  (ptr->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_01377d78;
  (ptr->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).buffer.ptr
       = (DebuggerScopeProperty *)0x0;
  (ptr->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count = 0;
  ptr->length = 0;
  ptr->increment = 4;
  Memory::
  WriteBarrierPtr<JsUtil::List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
  ::WriteBarrierSet(&this->scopeProperties,ptr);
  return;
}

Assistant:

void DebuggerScope::EnsurePropertyListIsAllocated()
    {
        if (this->scopeProperties == nullptr)
        {
            this->scopeProperties = RecyclerNew(this->recycler, DebuggerScopePropertyList, this->recycler);
        }
    }